

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd63_transform_output_pack8_avx
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  long lVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  undefined8 *puVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m256 _out05;
  __m256 _out03;
  __m256 _out01;
  __m256 _out04;
  __m256 _out02;
  __m256 _out00;
  __m256 _tmp135c_1;
  __m256 _tmp024c_1;
  __m256 _tmp135b_1;
  __m256 _tmp024b_1;
  __m256 _tmp135a_1;
  __m256 _tmp024a_1;
  __m256 _tmp07;
  __m256 _tmp06;
  __m256 _tmp05;
  __m256 _tmp04;
  __m256 _tmp03;
  __m256 _tmp02;
  __m256 _tmp01;
  __m256 _tmp00;
  int m_3;
  __m256 _tmp5m;
  __m256 _tmp3m;
  __m256 _tmp1m;
  __m256 _tmp4m;
  __m256 _tmp2m;
  __m256 _tmp0m;
  __m256 _tmp135c;
  __m256 _tmp024c;
  __m256 _tmp135b;
  __m256 _tmp024b;
  __m256 _tmp135a;
  __m256 _tmp024a;
  __m256 _out0tm7;
  __m256 _out0tm6;
  __m256 _out0tm5;
  __m256 _out0tm4;
  __m256 _out0tm3;
  __m256 _out0tm2;
  __m256 _out0tm1;
  __m256 _out0tm0;
  int m_2;
  float *output0;
  float *output0_tm_7;
  float *output0_tm_6;
  float *output0_tm_5;
  float *output0_tm_4;
  float *output0_tm_3;
  float *output0_tm_2;
  float *output0_tm_1;
  float *output0_tm_0;
  int j;
  int i;
  float tmp [6] [8] [8];
  __m256 _bias0;
  Mat out0;
  Mat out0_tm;
  int p;
  float *biasptr;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outch;
  int outh;
  int outw;
  Mat *m_1;
  Mat *m;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  int local_2ca4;
  int local_2a14;
  undefined8 *local_2a10;
  undefined8 *local_2a08;
  undefined1 (*local_2a00) [32];
  undefined1 (*local_29f8) [32];
  undefined1 (*local_29f0) [32];
  undefined1 (*local_29e8) [32];
  undefined1 (*local_29e0) [32];
  undefined1 (*local_29d8) [32];
  undefined8 *local_29d0;
  int local_29c8;
  int local_29c4;
  undefined8 local_29c0 [217];
  int local_22f4;
  float local_1f60;
  float fStack_1f5c;
  float fStack_1f58;
  float fStack_1f54;
  float fStack_1f50;
  float fStack_1f4c;
  float fStack_1f48;
  float fStack_1f44;
  float local_1f00;
  float fStack_1efc;
  float fStack_1ef8;
  float fStack_1ef4;
  float fStack_1ef0;
  float fStack_1eec;
  float fStack_1ee8;
  float fStack_1ee4;
  float local_1ea0;
  float fStack_1e9c;
  float fStack_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float fStack_1e88;
  float fStack_1e84;
  float local_1e40;
  float fStack_1e3c;
  float fStack_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  float fStack_1e28;
  float fStack_1e24;
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  float local_1d80;
  float fStack_1d7c;
  float fStack_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float fStack_1d68;
  float fStack_1d64;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  float local_1cc0;
  float fStack_1cbc;
  float fStack_1cb8;
  float fStack_1cb4;
  float fStack_1cb0;
  float fStack_1cac;
  float fStack_1ca8;
  float fStack_1ca4;
  float local_1c60;
  float fStack_1c5c;
  float fStack_1c58;
  float fStack_1c54;
  float fStack_1c50;
  float fStack_1c4c;
  float fStack_1c48;
  float fStack_1c44;
  float local_1c00;
  float fStack_1bfc;
  float fStack_1bf8;
  float fStack_1bf4;
  float fStack_1bf0;
  float fStack_1bec;
  float fStack_1be8;
  float fStack_1be4;
  float local_1ba0;
  float fStack_1b9c;
  float fStack_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  float fStack_1b88;
  float fStack_1b84;
  float local_1b40;
  float fStack_1b3c;
  float fStack_1b38;
  float fStack_1b34;
  float fStack_1b30;
  float fStack_1b2c;
  float fStack_1b28;
  float fStack_1b24;
  float local_1ae0;
  float fStack_1adc;
  float fStack_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  float local_1a80;
  float fStack_1a7c;
  float fStack_1a78;
  float fStack_1a74;
  float fStack_1a70;
  float fStack_1a6c;
  float fStack_1a68;
  float fStack_1a64;
  float local_1a20;
  float fStack_1a1c;
  float fStack_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  float fStack_1a08;
  float fStack_1a04;
  float local_19c0;
  float fStack_19bc;
  float fStack_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  float fStack_19a8;
  float fStack_19a4;
  float local_1960;
  float fStack_195c;
  float fStack_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float fStack_1948;
  float fStack_1944;
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  float fStack_18e4;
  float local_18a0;
  float fStack_189c;
  float fStack_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  float fStack_1888;
  float fStack_1884;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  float local_16e0;
  float fStack_16dc;
  float fStack_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  float fStack_16c8;
  float fStack_16c4;
  float fStack_15c4;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  float fStack_1344;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  float fStack_1124;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float local_1080;
  float fStack_107c;
  float fStack_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  float local_1020;
  float fStack_101c;
  float fStack_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  float fStack_1004;
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  float fStack_fe4;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  float local_f00;
  float fStack_efc;
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  float fStack_ee4;
  float local_ee0;
  float fStack_edc;
  float fStack_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float fStack_ec8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float local_ea0;
  float fStack_e9c;
  float fStack_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float fStack_e88;
  float fStack_e84;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float fStack_e24;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar43 = in_RSI[7];
  iVar44 = iVar1 / 6;
  iVar45 = (int)in_RSI[6] / 6;
  iVar46 = iVar44 * iVar45;
  lVar3 = *in_RDX;
  for (local_22f4 = 0; local_22f4 < (int)lVar43; local_22f4 = local_22f4 + 1) {
    lVar4 = *in_RDI;
    lVar5 = in_RDI[8];
    lVar6 = in_RDI[2];
    iVar2 = *(int *)((long)in_RSI + 0x2c);
    lVar7 = *in_RSI;
    lVar8 = in_RSI[8];
    lVar9 = in_RSI[2];
    lVar10 = in_RSI[2];
    if (lVar3 == 0) {
      local_2fa0 = 0;
      uStack_2f98 = 0;
      uStack_2f90 = 0;
      uStack_2f88 = 0;
    }
    else {
      puVar47 = (undefined8 *)(lVar3 + (long)(local_22f4 << 3) * 4);
      local_2fa0 = *puVar47;
      uStack_2f98 = puVar47[1];
      uStack_2f90 = puVar47[2];
      uStack_2f88 = puVar47[3];
    }
    local_29c0[0xc0] = local_2fa0;
    local_29c0[0xc1] = uStack_2f98;
    local_29c0[0xc2] = uStack_2f90;
    for (local_29c4 = 0; local_29c4 < iVar45; local_29c4 = local_29c4 + 1) {
      for (local_29c8 = 0; local_29c8 < iVar44; local_29c8 = local_29c8 + 1) {
        local_29d0 = (undefined8 *)
                     (lVar4 + lVar5 * local_22f4 * lVar6 +
                     (long)((local_29c4 * iVar44 + local_29c8) * 8) * 4);
        local_29d8 = (undefined1 (*) [32])((long)local_29d0 + (long)(iVar46 * 8) * 4);
        local_29e0 = (undefined1 (*) [32])((long)local_29d0 + (long)(iVar46 * 0x10) * 4);
        local_29e8 = (undefined1 (*) [32])((long)local_29d0 + (long)(iVar46 * 0x18) * 4);
        local_29f0 = (undefined1 (*) [32])((long)local_29d0 + (long)(iVar46 * 0x20) * 4);
        local_29f8 = (undefined1 (*) [32])((long)local_29d0 + (long)(iVar46 * 0x28) * 4);
        local_2a00 = (undefined1 (*) [32])((long)local_29d0 + (long)(iVar46 * 0x30) * 4);
        local_2a08 = (undefined8 *)((long)local_29d0 + (long)(iVar46 * 0x38) * 4);
        local_2a10 = (undefined8 *)
                     (lVar7 + lVar8 * local_22f4 * lVar9 +
                      (long)iVar2 * (long)(local_29c4 * 6) * lVar10 + (long)(local_29c8 * 0x30) * 4)
        ;
        for (local_2a14 = 0; local_2a14 < 8; local_2a14 = local_2a14 + 1) {
          local_e40 = (float)*(undefined8 *)*local_29d8;
          fStack_e3c = (float)((ulong)*(undefined8 *)*local_29d8 >> 0x20);
          fStack_e38 = (float)*(undefined8 *)(*local_29d8 + 8);
          fStack_e34 = (float)((ulong)*(undefined8 *)(*local_29d8 + 8) >> 0x20);
          fStack_e30 = (float)*(undefined8 *)(*local_29d8 + 0x10);
          fStack_e2c = (float)((ulong)*(undefined8 *)(*local_29d8 + 0x10) >> 0x20);
          fStack_e28 = (float)*(undefined8 *)(*local_29d8 + 0x18);
          fStack_e24 = (float)((ulong)*(undefined8 *)(*local_29d8 + 0x18) >> 0x20);
          local_e60 = (float)*(undefined8 *)*local_29e0;
          fStack_e5c = (float)((ulong)*(undefined8 *)*local_29e0 >> 0x20);
          fStack_e58 = (float)*(undefined8 *)(*local_29e0 + 8);
          fStack_e54 = (float)((ulong)*(undefined8 *)(*local_29e0 + 8) >> 0x20);
          fStack_e50 = (float)*(undefined8 *)(*local_29e0 + 0x10);
          fStack_e4c = (float)((ulong)*(undefined8 *)(*local_29e0 + 0x10) >> 0x20);
          fStack_e48 = (float)*(undefined8 *)(*local_29e0 + 0x18);
          fStack_e44 = (float)((ulong)*(undefined8 *)(*local_29e0 + 0x18) >> 0x20);
          local_e40 = local_e40 + local_e60;
          fStack_e3c = fStack_e3c + fStack_e5c;
          fStack_e38 = fStack_e38 + fStack_e58;
          fStack_e34 = fStack_e34 + fStack_e54;
          fStack_e30 = fStack_e30 + fStack_e50;
          fStack_e2c = fStack_e2c + fStack_e4c;
          fStack_e28 = fStack_e28 + fStack_e48;
          fStack_e24 = fStack_e24 + fStack_e44;
          auVar15 = vsubps_avx(*local_29d8,*local_29e0);
          local_e80 = (float)*(undefined8 *)*local_29e8;
          fStack_e7c = (float)((ulong)*(undefined8 *)*local_29e8 >> 0x20);
          fStack_e78 = (float)*(undefined8 *)(*local_29e8 + 8);
          fStack_e74 = (float)((ulong)*(undefined8 *)(*local_29e8 + 8) >> 0x20);
          fStack_e70 = (float)*(undefined8 *)(*local_29e8 + 0x10);
          fStack_e6c = (float)((ulong)*(undefined8 *)(*local_29e8 + 0x10) >> 0x20);
          fStack_e68 = (float)*(undefined8 *)(*local_29e8 + 0x18);
          fStack_e64 = (float)((ulong)*(undefined8 *)(*local_29e8 + 0x18) >> 0x20);
          local_ea0 = (float)*(undefined8 *)*local_29f0;
          fStack_e9c = (float)((ulong)*(undefined8 *)*local_29f0 >> 0x20);
          fStack_e98 = (float)*(undefined8 *)(*local_29f0 + 8);
          fStack_e94 = (float)((ulong)*(undefined8 *)(*local_29f0 + 8) >> 0x20);
          fStack_e90 = (float)*(undefined8 *)(*local_29f0 + 0x10);
          fStack_e8c = (float)((ulong)*(undefined8 *)(*local_29f0 + 0x10) >> 0x20);
          fStack_e88 = (float)*(undefined8 *)(*local_29f0 + 0x18);
          fStack_e84 = (float)((ulong)*(undefined8 *)(*local_29f0 + 0x18) >> 0x20);
          local_e80 = local_e80 + local_ea0;
          fStack_e7c = fStack_e7c + fStack_e9c;
          fStack_e78 = fStack_e78 + fStack_e98;
          fStack_e74 = fStack_e74 + fStack_e94;
          fStack_e70 = fStack_e70 + fStack_e90;
          fStack_e6c = fStack_e6c + fStack_e8c;
          fStack_e68 = fStack_e68 + fStack_e88;
          auVar16 = vsubps_avx(*local_29e8,*local_29f0);
          local_ec0 = (float)*(undefined8 *)*local_29f8;
          fStack_ebc = (float)((ulong)*(undefined8 *)*local_29f8 >> 0x20);
          fStack_eb8 = (float)*(undefined8 *)(*local_29f8 + 8);
          fStack_eb4 = (float)((ulong)*(undefined8 *)(*local_29f8 + 8) >> 0x20);
          fStack_eb0 = (float)*(undefined8 *)(*local_29f8 + 0x10);
          fStack_eac = (float)((ulong)*(undefined8 *)(*local_29f8 + 0x10) >> 0x20);
          fStack_ea8 = (float)*(undefined8 *)(*local_29f8 + 0x18);
          local_ee0 = (float)*(undefined8 *)*local_2a00;
          fStack_edc = (float)((ulong)*(undefined8 *)*local_2a00 >> 0x20);
          fStack_ed8 = (float)*(undefined8 *)(*local_2a00 + 8);
          fStack_ed4 = (float)((ulong)*(undefined8 *)(*local_2a00 + 8) >> 0x20);
          fStack_ed0 = (float)*(undefined8 *)(*local_2a00 + 0x10);
          fStack_ecc = (float)((ulong)*(undefined8 *)(*local_2a00 + 0x10) >> 0x20);
          fStack_ec8 = (float)*(undefined8 *)(*local_2a00 + 0x18);
          local_ec0 = local_ec0 + local_ee0;
          fStack_ebc = fStack_ebc + fStack_edc;
          fStack_eb8 = fStack_eb8 + fStack_ed8;
          fStack_eb4 = fStack_eb4 + fStack_ed4;
          fStack_eb0 = fStack_eb0 + fStack_ed0;
          fStack_eac = fStack_eac + fStack_ecc;
          fStack_ea8 = fStack_ea8 + fStack_ec8;
          auVar17 = vsubps_avx(*local_29f8,*local_2a00);
          local_f00 = (float)*local_29d0;
          fStack_efc = (float)((ulong)*local_29d0 >> 0x20);
          fStack_ef8 = (float)local_29d0[1];
          fStack_ef4 = (float)((ulong)local_29d0[1] >> 0x20);
          fStack_ef0 = (float)local_29d0[2];
          fStack_eec = (float)((ulong)local_29d0[2] >> 0x20);
          fStack_ee8 = (float)local_29d0[3];
          fStack_ee4 = (float)((ulong)local_29d0[3] >> 0x20);
          auVar11 = vinsertps_avx(ZEXT416(0x42000000),ZEXT416(0x42000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x42000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x42000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x42000000),ZEXT416(0x42000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x42000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x42000000),0x30);
          local_1840 = auVar12._0_4_;
          fStack_183c = auVar12._4_4_;
          fStack_1838 = auVar12._8_4_;
          fStack_1834 = auVar12._12_4_;
          fStack_1830 = auVar11._0_4_;
          fStack_182c = auVar11._4_4_;
          fStack_1828 = auVar11._8_4_;
          fStack_1824 = auVar11._12_4_;
          auVar11 = vinsertps_avx(ZEXT416(0x41000000),ZEXT416(0x41000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x41000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x41000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x41000000),ZEXT416(0x41000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x41000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x41000000),0x30);
          auVar13 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40800000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40800000),0x30);
          auVar14 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x40800000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x40800000),0x30);
          local_18a0 = auVar14._0_4_;
          fStack_189c = auVar14._4_4_;
          fStack_1898 = auVar14._8_4_;
          fStack_1894 = auVar14._12_4_;
          fStack_1890 = auVar13._0_4_;
          fStack_188c = auVar13._4_4_;
          fStack_1888 = auVar13._8_4_;
          fStack_1884 = auVar13._12_4_;
          local_1900 = auVar12._0_4_;
          fStack_18fc = auVar12._4_4_;
          fStack_18f8 = auVar12._8_4_;
          fStack_18f4 = auVar12._12_4_;
          fStack_18f0 = auVar11._0_4_;
          fStack_18ec = auVar11._4_4_;
          fStack_18e8 = auVar11._8_4_;
          fStack_18e4 = auVar11._12_4_;
          auVar11 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40000000),0x30);
          auVar13 = vinsertps_avx(ZEXT416(0x41800000),ZEXT416(0x41800000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x41800000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x41800000),0x30);
          auVar14 = vinsertps_avx(ZEXT416(0x41800000),ZEXT416(0x41800000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x41800000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x41800000),0x30);
          local_1960 = auVar14._0_4_;
          fStack_195c = auVar14._4_4_;
          fStack_1958 = auVar14._8_4_;
          fStack_1954 = auVar14._12_4_;
          fStack_1950 = auVar13._0_4_;
          fStack_194c = auVar13._4_4_;
          fStack_1948 = auVar13._8_4_;
          fStack_1944 = auVar13._12_4_;
          local_19c0 = auVar12._0_4_;
          fStack_19bc = auVar12._4_4_;
          fStack_19b8 = auVar12._8_4_;
          fStack_19b4 = auVar12._12_4_;
          fStack_19b0 = auVar11._0_4_;
          fStack_19ac = auVar11._4_4_;
          fStack_19a8 = auVar11._8_4_;
          fStack_19a4 = auVar11._12_4_;
          auVar11 = vinsertps_avx(ZEXT416(0x41800000),ZEXT416(0x41800000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x41800000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x41800000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x41800000),ZEXT416(0x41800000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x41800000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x41800000),0x30);
          auVar13 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40000000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40000000),0x30);
          auVar14 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x40000000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x40000000),0x30);
          local_1a20 = auVar14._0_4_;
          fStack_1a1c = auVar14._4_4_;
          fStack_1a18 = auVar14._8_4_;
          fStack_1a14 = auVar14._12_4_;
          fStack_1a10 = auVar13._0_4_;
          fStack_1a0c = auVar13._4_4_;
          fStack_1a08 = auVar13._8_4_;
          fStack_1a04 = auVar13._12_4_;
          local_ce0 = auVar16._0_4_;
          fStack_cdc = auVar16._4_4_;
          fStack_cd8 = auVar16._8_4_;
          fStack_cd4 = auVar16._12_4_;
          fStack_cd0 = auVar16._16_4_;
          fStack_ccc = auVar16._20_4_;
          fStack_cc8 = auVar16._24_4_;
          local_16e0 = auVar15._0_4_;
          fStack_16dc = auVar15._4_4_;
          fStack_16d8 = auVar15._8_4_;
          fStack_16d4 = auVar15._12_4_;
          fStack_16d0 = auVar15._16_4_;
          fStack_16cc = auVar15._20_4_;
          fStack_16c8 = auVar15._24_4_;
          fStack_16c4 = auVar15._28_4_;
          local_1a80 = auVar12._0_4_;
          fStack_1a7c = auVar12._4_4_;
          fStack_1a78 = auVar12._8_4_;
          fStack_1a74 = auVar12._12_4_;
          fStack_1a70 = auVar11._0_4_;
          fStack_1a6c = auVar11._4_4_;
          fStack_1a68 = auVar11._8_4_;
          fStack_1a64 = auVar11._12_4_;
          local_ca0 = auVar17._0_4_;
          fStack_c9c = auVar17._4_4_;
          fStack_c98 = auVar17._8_4_;
          fStack_c94 = auVar17._12_4_;
          fStack_c90 = auVar17._16_4_;
          fStack_c8c = auVar17._20_4_;
          fStack_c88 = auVar17._24_4_;
          auVar11 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40800000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40800000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40800000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40800000),0x30);
          auVar13 = vinsertps_avx(ZEXT416(0x41000000),ZEXT416(0x41000000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x41000000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x41000000),0x30);
          auVar14 = vinsertps_avx(ZEXT416(0x41000000),ZEXT416(0x41000000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x41000000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x41000000),0x30);
          local_1ae0 = auVar14._0_4_;
          fStack_1adc = auVar14._4_4_;
          fStack_1ad8 = auVar14._8_4_;
          fStack_1ad4 = auVar14._12_4_;
          fStack_1ad0 = auVar13._0_4_;
          fStack_1acc = auVar13._4_4_;
          fStack_1ac8 = auVar13._8_4_;
          fStack_1ac4 = auVar13._12_4_;
          local_1b40 = auVar12._0_4_;
          fStack_1b3c = auVar12._4_4_;
          fStack_1b38 = auVar12._8_4_;
          fStack_1b34 = auVar12._12_4_;
          fStack_1b30 = auVar11._0_4_;
          fStack_1b2c = auVar11._4_4_;
          fStack_1b28 = auVar11._8_4_;
          fStack_1b24 = auVar11._12_4_;
          local_f80 = (float)*local_2a08;
          fStack_f7c = (float)((ulong)*local_2a08 >> 0x20);
          fStack_f78 = (float)local_2a08[1];
          fStack_f74 = (float)((ulong)local_2a08[1] >> 0x20);
          fStack_f70 = (float)local_2a08[2];
          fStack_f6c = (float)((ulong)local_2a08[2] >> 0x20);
          fStack_f68 = (float)local_2a08[3];
          fStack_f64 = (float)((ulong)local_2a08[3] >> 0x20);
          auVar11 = vinsertps_avx(ZEXT416(0x42000000),ZEXT416(0x42000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x42000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x42000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x42000000),ZEXT416(0x42000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x42000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x42000000),0x30);
          local_1ba0 = auVar12._0_4_;
          fStack_1b9c = auVar12._4_4_;
          fStack_1b98 = auVar12._8_4_;
          fStack_1b94 = auVar12._12_4_;
          fStack_1b90 = auVar11._0_4_;
          fStack_1b8c = auVar11._4_4_;
          fStack_1b88 = auVar11._8_4_;
          fStack_1b84 = auVar11._12_4_;
          fStack_15c4 = auVar17._28_4_;
          lVar51 = (long)local_2a14;
          local_29c0[lVar51 * 4] =
               CONCAT44(fStack_efc + fStack_e3c + fStack_183c * fStack_ebc + fStack_e7c,
                        local_f00 + local_e40 + local_1840 * local_ec0 + local_e80);
          local_29c0[lVar51 * 4 + 1] =
               CONCAT44(fStack_ef4 + fStack_e34 + fStack_1834 * fStack_eb4 + fStack_e74,
                        fStack_ef8 + fStack_e38 + fStack_1838 * fStack_eb8 + fStack_e78);
          local_29c0[lVar51 * 4 + 2] =
               CONCAT44(fStack_eec + fStack_e2c + fStack_182c * fStack_eac + fStack_e6c,
                        fStack_ef0 + fStack_e30 + fStack_1830 * fStack_eb0 + fStack_e70);
          local_29c0[lVar51 * 4 + 3] =
               CONCAT44(fStack_ee4 + fStack_e24 + fStack_1824 + fStack_e64 + fStack_e84,
                        fStack_ee8 + fStack_e28 + fStack_1828 * fStack_ea8 + fStack_e68);
          lVar51 = (long)local_2a14;
          local_29c0[lVar51 * 4 + 0x20] =
               CONCAT44(fStack_1a7c * fStack_c9c + fStack_1a1c * fStack_cdc + fStack_16dc,
                        local_1a80 * local_ca0 + local_1a20 * local_ce0 + local_16e0);
          local_29c0[lVar51 * 4 + 0x21] =
               CONCAT44(fStack_1a74 * fStack_c94 + fStack_1a14 * fStack_cd4 + fStack_16d4,
                        fStack_1a78 * fStack_c98 + fStack_1a18 * fStack_cd8 + fStack_16d8);
          local_29c0[lVar51 * 4 + 0x22] =
               CONCAT44(fStack_1a6c * fStack_c8c + fStack_1a0c * fStack_ccc + fStack_16cc,
                        fStack_1a70 * fStack_c90 + fStack_1a10 * fStack_cd0 + fStack_16d0);
          local_29c0[lVar51 * 4 + 0x23] =
               CONCAT44(fStack_1a64 + fStack_1a04 + fStack_16c4,
                        fStack_1a68 * fStack_c88 + fStack_1a08 * fStack_cc8 + fStack_16c8);
          lVar51 = (long)local_2a14;
          local_29c0[lVar51 * 4 + 0x40] =
               CONCAT44(fStack_18fc * fStack_ebc + fStack_189c * fStack_e7c + fStack_e3c,
                        local_1900 * local_ec0 + local_18a0 * local_e80 + local_e40);
          local_29c0[lVar51 * 4 + 0x41] =
               CONCAT44(fStack_18f4 * fStack_eb4 + fStack_1894 * fStack_e74 + fStack_e34,
                        fStack_18f8 * fStack_eb8 + fStack_1898 * fStack_e78 + fStack_e38);
          local_29c0[lVar51 * 4 + 0x42] =
               CONCAT44(fStack_18ec * fStack_eac + fStack_188c * fStack_e6c + fStack_e2c,
                        fStack_18f0 * fStack_eb0 + fStack_1890 * fStack_e70 + fStack_e30);
          local_29c0[lVar51 * 4 + 0x43] =
               CONCAT44(fStack_18e4 + fStack_1884 + fStack_e24,
                        fStack_18e8 * fStack_ea8 + fStack_1888 * fStack_e68 + fStack_e28);
          lVar51 = (long)local_2a14;
          local_29c0[lVar51 * 4 + 0x60] =
               CONCAT44(fStack_1b3c * fStack_c9c + fStack_1adc * fStack_cdc + fStack_16dc,
                        local_1b40 * local_ca0 + local_1ae0 * local_ce0 + local_16e0);
          local_29c0[lVar51 * 4 + 0x61] =
               CONCAT44(fStack_1b34 * fStack_c94 + fStack_1ad4 * fStack_cd4 + fStack_16d4,
                        fStack_1b38 * fStack_c98 + fStack_1ad8 * fStack_cd8 + fStack_16d8);
          local_29c0[lVar51 * 4 + 0x62] =
               CONCAT44(fStack_1b2c * fStack_c8c + fStack_1acc * fStack_ccc + fStack_16cc,
                        fStack_1b30 * fStack_c90 + fStack_1ad0 * fStack_cd0 + fStack_16d0);
          local_29c0[lVar51 * 4 + 99] =
               CONCAT44(fStack_1b24 + fStack_1ac4 + fStack_16c4,
                        fStack_1b28 * fStack_c88 + fStack_1ac8 * fStack_cc8 + fStack_16c8);
          lVar51 = (long)local_2a14;
          local_29c0[lVar51 * 4 + 0x80] =
               CONCAT44(fStack_19bc * fStack_ebc + fStack_195c * fStack_e7c + fStack_e3c,
                        local_19c0 * local_ec0 + local_1960 * local_e80 + local_e40);
          local_29c0[lVar51 * 4 + 0x81] =
               CONCAT44(fStack_19b4 * fStack_eb4 + fStack_1954 * fStack_e74 + fStack_e34,
                        fStack_19b8 * fStack_eb8 + fStack_1958 * fStack_e78 + fStack_e38);
          local_29c0[lVar51 * 4 + 0x82] =
               CONCAT44(fStack_19ac * fStack_eac + fStack_194c * fStack_e6c + fStack_e2c,
                        fStack_19b0 * fStack_eb0 + fStack_1950 * fStack_e70 + fStack_e30);
          local_29c0[lVar51 * 4 + 0x83] =
               CONCAT44(fStack_19a4 + fStack_1944 + fStack_e24,
                        fStack_19a8 * fStack_ea8 + fStack_1948 * fStack_e68 + fStack_e28);
          lVar51 = (long)local_2a14;
          local_29c0[lVar51 * 4 + 0xa0] =
               CONCAT44(fStack_f7c + fStack_16dc + fStack_1b9c * fStack_cdc + fStack_c9c,
                        local_f80 + local_16e0 + local_1ba0 * local_ce0 + local_ca0);
          local_29c0[lVar51 * 4 + 0xa1] =
               CONCAT44(fStack_f74 + fStack_16d4 + fStack_1b94 * fStack_cd4 + fStack_c94,
                        fStack_f78 + fStack_16d8 + fStack_1b98 * fStack_cd8 + fStack_c98);
          local_29c0[lVar51 * 4 + 0xa2] =
               CONCAT44(fStack_f6c + fStack_16cc + fStack_1b8c * fStack_ccc + fStack_c8c,
                        fStack_f70 + fStack_16d0 + fStack_1b90 * fStack_cd0 + fStack_c90);
          local_29c0[lVar51 * 4 + 0xa3] =
               CONCAT44(fStack_f64 + fStack_16c4 + fStack_1b84 + fStack_15c4,
                        fStack_f68 + fStack_16c8 + fStack_1b88 * fStack_cc8 + fStack_c88);
          local_29d0 = (undefined8 *)((long)local_29d0 + (long)(iVar46 * 0x40) * 4);
          local_29d8 = (undefined1 (*) [32])(*local_29d8 + (long)(iVar46 * 0x40) * 4);
          local_29e0 = (undefined1 (*) [32])(*local_29e0 + (long)(iVar46 * 0x40) * 4);
          local_29e8 = (undefined1 (*) [32])(*local_29e8 + (long)(iVar46 * 0x40) * 4);
          local_29f0 = (undefined1 (*) [32])(*local_29f0 + (long)(iVar46 * 0x40) * 4);
          local_29f8 = (undefined1 (*) [32])(*local_29f8 + (long)(iVar46 * 0x40) * 4);
          local_2a00 = (undefined1 (*) [32])(*local_2a00 + (long)(iVar46 * 0x40) * 4);
          local_2a08 = (undefined8 *)((long)local_2a08 + (long)(iVar46 * 0x40) * 4);
        }
        for (local_2ca4 = 0; local_2ca4 < 6; local_2ca4 = local_2ca4 + 1) {
          lVar51 = (long)local_2ca4;
          lVar48 = (long)local_2ca4;
          uVar18 = local_29c0[lVar48 * 0x20 + 4];
          uVar19 = local_29c0[lVar48 * 0x20 + 5];
          uVar20 = local_29c0[lVar48 * 0x20 + 6];
          uVar21 = local_29c0[lVar48 * 0x20 + 7];
          lVar48 = (long)local_2ca4;
          uVar22 = local_29c0[lVar48 * 0x20 + 8];
          uVar23 = local_29c0[lVar48 * 0x20 + 9];
          uVar24 = local_29c0[lVar48 * 0x20 + 10];
          uVar25 = local_29c0[lVar48 * 0x20 + 0xb];
          lVar48 = (long)local_2ca4;
          uVar26 = local_29c0[lVar48 * 0x20 + 0xc];
          uVar27 = local_29c0[lVar48 * 0x20 + 0xd];
          uVar28 = local_29c0[lVar48 * 0x20 + 0xe];
          uVar29 = local_29c0[lVar48 * 0x20 + 0xf];
          lVar48 = (long)local_2ca4;
          uVar30 = local_29c0[lVar48 * 0x20 + 0x10];
          uVar31 = local_29c0[lVar48 * 0x20 + 0x11];
          uVar32 = local_29c0[lVar48 * 0x20 + 0x12];
          uVar33 = local_29c0[lVar48 * 0x20 + 0x13];
          lVar48 = (long)local_2ca4;
          uVar34 = local_29c0[lVar48 * 0x20 + 0x14];
          uVar35 = local_29c0[lVar48 * 0x20 + 0x15];
          uVar36 = local_29c0[lVar48 * 0x20 + 0x16];
          lVar49 = (long)local_2ca4;
          uVar37 = local_29c0[lVar49 * 0x20 + 0x18];
          uVar38 = local_29c0[lVar49 * 0x20 + 0x19];
          uVar39 = local_29c0[lVar49 * 0x20 + 0x1a];
          lVar50 = (long)local_2ca4;
          local_1000 = (float)uVar18;
          fStack_ffc = (float)((ulong)uVar18 >> 0x20);
          fStack_ff8 = (float)uVar19;
          fStack_ff4 = (float)((ulong)uVar19 >> 0x20);
          fStack_ff0 = (float)uVar20;
          fStack_fec = (float)((ulong)uVar20 >> 0x20);
          fStack_fe8 = (float)uVar21;
          fStack_fe4 = (float)((ulong)uVar21 >> 0x20);
          local_1020 = (float)uVar22;
          fStack_101c = (float)((ulong)uVar22 >> 0x20);
          fStack_1018 = (float)uVar23;
          fStack_1014 = (float)((ulong)uVar23 >> 0x20);
          fStack_1010 = (float)uVar24;
          fStack_100c = (float)((ulong)uVar24 >> 0x20);
          fStack_1008 = (float)uVar25;
          fStack_1004 = (float)((ulong)uVar25 >> 0x20);
          local_1000 = local_1000 + local_1020;
          fStack_ffc = fStack_ffc + fStack_101c;
          fStack_ff8 = fStack_ff8 + fStack_1018;
          fStack_ff4 = fStack_ff4 + fStack_1014;
          fStack_ff0 = fStack_ff0 + fStack_1010;
          fStack_fec = fStack_fec + fStack_100c;
          fStack_fe8 = fStack_fe8 + fStack_1008;
          fStack_fe4 = fStack_fe4 + fStack_1004;
          auVar42._8_8_ = uVar19;
          auVar42._0_8_ = uVar18;
          auVar42._16_8_ = uVar20;
          auVar42._24_8_ = uVar21;
          auVar15._8_8_ = uVar23;
          auVar15._0_8_ = uVar22;
          auVar15._16_8_ = uVar24;
          auVar15._24_8_ = uVar25;
          auVar15 = vsubps_avx(auVar42,auVar15);
          local_1040 = (float)uVar26;
          fStack_103c = (float)((ulong)uVar26 >> 0x20);
          fStack_1038 = (float)uVar27;
          fStack_1034 = (float)((ulong)uVar27 >> 0x20);
          fStack_1030 = (float)uVar28;
          fStack_102c = (float)((ulong)uVar28 >> 0x20);
          fStack_1028 = (float)uVar29;
          fStack_1024 = (float)((ulong)uVar29 >> 0x20);
          local_1060 = (float)uVar30;
          fStack_105c = (float)((ulong)uVar30 >> 0x20);
          fStack_1058 = (float)uVar31;
          fStack_1054 = (float)((ulong)uVar31 >> 0x20);
          fStack_1050 = (float)uVar32;
          fStack_104c = (float)((ulong)uVar32 >> 0x20);
          fStack_1048 = (float)uVar33;
          fStack_1044 = (float)((ulong)uVar33 >> 0x20);
          local_1040 = local_1040 + local_1060;
          fStack_103c = fStack_103c + fStack_105c;
          fStack_1038 = fStack_1038 + fStack_1058;
          fStack_1034 = fStack_1034 + fStack_1054;
          fStack_1030 = fStack_1030 + fStack_1050;
          fStack_102c = fStack_102c + fStack_104c;
          fStack_1028 = fStack_1028 + fStack_1048;
          auVar41._8_8_ = uVar27;
          auVar41._0_8_ = uVar26;
          auVar41._16_8_ = uVar28;
          auVar41._24_8_ = uVar29;
          auVar16._8_8_ = uVar31;
          auVar16._0_8_ = uVar30;
          auVar16._16_8_ = uVar32;
          auVar16._24_8_ = uVar33;
          auVar16 = vsubps_avx(auVar41,auVar16);
          local_1080 = (float)uVar34;
          fStack_107c = (float)((ulong)uVar34 >> 0x20);
          fStack_1078 = (float)uVar35;
          fStack_1074 = (float)((ulong)uVar35 >> 0x20);
          fStack_1070 = (float)uVar36;
          fStack_106c = (float)((ulong)uVar36 >> 0x20);
          fStack_1068 = (float)local_29c0[lVar48 * 0x20 + 0x17];
          local_10a0 = (float)uVar37;
          fStack_109c = (float)((ulong)uVar37 >> 0x20);
          fStack_1098 = (float)uVar38;
          fStack_1094 = (float)((ulong)uVar38 >> 0x20);
          fStack_1090 = (float)uVar39;
          fStack_108c = (float)((ulong)uVar39 >> 0x20);
          fStack_1088 = (float)local_29c0[lVar49 * 0x20 + 0x1b];
          local_1080 = local_1080 + local_10a0;
          fStack_107c = fStack_107c + fStack_109c;
          fStack_1078 = fStack_1078 + fStack_1098;
          fStack_1074 = fStack_1074 + fStack_1094;
          fStack_1070 = fStack_1070 + fStack_1090;
          fStack_106c = fStack_106c + fStack_108c;
          fStack_1068 = fStack_1068 + fStack_1088;
          auVar40._8_8_ = uVar35;
          auVar40._0_8_ = uVar34;
          auVar40._16_8_ = uVar36;
          auVar40._24_8_ = local_29c0[lVar48 * 0x20 + 0x17];
          auVar17._8_8_ = uVar38;
          auVar17._0_8_ = uVar37;
          auVar17._16_8_ = uVar39;
          auVar17._24_8_ = local_29c0[lVar49 * 0x20 + 0x1b];
          auVar17 = vsubps_avx(auVar40,auVar17);
          local_10c0 = (float)local_29c0[lVar51 * 0x20];
          fStack_10bc = (float)((ulong)local_29c0[lVar51 * 0x20] >> 0x20);
          fStack_10b8 = (float)local_29c0[lVar51 * 0x20 + 1];
          fStack_10b4 = (float)((ulong)local_29c0[lVar51 * 0x20 + 1] >> 0x20);
          fStack_10b0 = (float)local_29c0[lVar51 * 0x20 + 2];
          fStack_10ac = (float)((ulong)local_29c0[lVar51 * 0x20 + 2] >> 0x20);
          fStack_10a8 = (float)local_29c0[lVar51 * 0x20 + 3];
          fStack_10a4 = (float)((ulong)local_29c0[lVar51 * 0x20 + 3] >> 0x20);
          auVar11 = vinsertps_avx(ZEXT416(0x42000000),ZEXT416(0x42000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x42000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x42000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x42000000),ZEXT416(0x42000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x42000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x42000000),0x30);
          local_1c00 = auVar12._0_4_;
          fStack_1bfc = auVar12._4_4_;
          fStack_1bf8 = auVar12._8_4_;
          fStack_1bf4 = auVar12._12_4_;
          fStack_1bf0 = auVar11._0_4_;
          fStack_1bec = auVar11._4_4_;
          fStack_1be8 = auVar11._8_4_;
          fStack_1be4 = auVar11._12_4_;
          local_1140 = (float)local_29c0[0xc0];
          fStack_113c = (float)((ulong)local_29c0[0xc0] >> 0x20);
          fStack_1138 = (float)local_29c0[0xc1];
          fStack_1134 = (float)((ulong)local_29c0[0xc1] >> 0x20);
          fStack_1130 = (float)local_29c0[0xc2];
          fStack_112c = (float)((ulong)local_29c0[0xc2] >> 0x20);
          fStack_1128 = (float)uStack_2f88;
          fStack_1124 = (float)((ulong)uStack_2f88 >> 0x20);
          auVar11 = vinsertps_avx(ZEXT416(0x41000000),ZEXT416(0x41000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x41000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x41000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x41000000),ZEXT416(0x41000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x41000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x41000000),0x30);
          auVar13 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40800000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40800000),0x30);
          auVar14 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x40800000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x40800000),0x30);
          local_1c60 = auVar14._0_4_;
          fStack_1c5c = auVar14._4_4_;
          fStack_1c58 = auVar14._8_4_;
          fStack_1c54 = auVar14._12_4_;
          fStack_1c50 = auVar13._0_4_;
          fStack_1c4c = auVar13._4_4_;
          fStack_1c48 = auVar13._8_4_;
          fStack_1c44 = auVar13._12_4_;
          local_1cc0 = auVar12._0_4_;
          fStack_1cbc = auVar12._4_4_;
          fStack_1cb8 = auVar12._8_4_;
          fStack_1cb4 = auVar12._12_4_;
          fStack_1cb0 = auVar11._0_4_;
          fStack_1cac = auVar11._4_4_;
          fStack_1ca8 = auVar11._8_4_;
          fStack_1ca4 = auVar11._12_4_;
          auVar11 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40000000),0x30);
          auVar13 = vinsertps_avx(ZEXT416(0x41800000),ZEXT416(0x41800000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x41800000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x41800000),0x30);
          auVar14 = vinsertps_avx(ZEXT416(0x41800000),ZEXT416(0x41800000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x41800000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x41800000),0x30);
          local_1d20 = auVar14._0_4_;
          fStack_1d1c = auVar14._4_4_;
          fStack_1d18 = auVar14._8_4_;
          fStack_1d14 = auVar14._12_4_;
          fStack_1d10 = auVar13._0_4_;
          fStack_1d0c = auVar13._4_4_;
          fStack_1d08 = auVar13._8_4_;
          fStack_1d04 = auVar13._12_4_;
          local_1d80 = auVar12._0_4_;
          fStack_1d7c = auVar12._4_4_;
          fStack_1d78 = auVar12._8_4_;
          fStack_1d74 = auVar12._12_4_;
          fStack_1d70 = auVar11._0_4_;
          fStack_1d6c = auVar11._4_4_;
          fStack_1d68 = auVar11._8_4_;
          fStack_1d64 = auVar11._12_4_;
          auVar11 = vinsertps_avx(ZEXT416(0x41800000),ZEXT416(0x41800000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x41800000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x41800000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x41800000),ZEXT416(0x41800000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x41800000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x41800000),0x30);
          auVar13 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40000000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x40000000),0x30);
          auVar14 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x40000000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x40000000),0x30);
          local_1de0 = auVar14._0_4_;
          fStack_1ddc = auVar14._4_4_;
          fStack_1dd8 = auVar14._8_4_;
          fStack_1dd4 = auVar14._12_4_;
          fStack_1dd0 = auVar13._0_4_;
          fStack_1dcc = auVar13._4_4_;
          fStack_1dc8 = auVar13._8_4_;
          fStack_1dc4 = auVar13._12_4_;
          local_a60 = auVar16._0_4_;
          fStack_a5c = auVar16._4_4_;
          fStack_a58 = auVar16._8_4_;
          fStack_a54 = auVar16._12_4_;
          fStack_a50 = auVar16._16_4_;
          fStack_a4c = auVar16._20_4_;
          fStack_a48 = auVar16._24_4_;
          local_1460 = auVar15._0_4_;
          fStack_145c = auVar15._4_4_;
          fStack_1458 = auVar15._8_4_;
          fStack_1454 = auVar15._12_4_;
          fStack_1450 = auVar15._16_4_;
          fStack_144c = auVar15._20_4_;
          fStack_1448 = auVar15._24_4_;
          fStack_1444 = auVar15._28_4_;
          local_1e40 = auVar12._0_4_;
          fStack_1e3c = auVar12._4_4_;
          fStack_1e38 = auVar12._8_4_;
          fStack_1e34 = auVar12._12_4_;
          fStack_1e30 = auVar11._0_4_;
          fStack_1e2c = auVar11._4_4_;
          fStack_1e28 = auVar11._8_4_;
          fStack_1e24 = auVar11._12_4_;
          local_a20 = auVar17._0_4_;
          fStack_a1c = auVar17._4_4_;
          fStack_a18 = auVar17._8_4_;
          fStack_a14 = auVar17._12_4_;
          fStack_a10 = auVar17._16_4_;
          fStack_a0c = auVar17._20_4_;
          fStack_a08 = auVar17._24_4_;
          auVar11 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40800000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40800000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40800000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40800000),0x30);
          auVar13 = vinsertps_avx(ZEXT416(0x41000000),ZEXT416(0x41000000),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x41000000),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(0x41000000),0x30);
          auVar14 = vinsertps_avx(ZEXT416(0x41000000),ZEXT416(0x41000000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x41000000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x41000000),0x30);
          local_1ea0 = auVar14._0_4_;
          fStack_1e9c = auVar14._4_4_;
          fStack_1e98 = auVar14._8_4_;
          fStack_1e94 = auVar14._12_4_;
          fStack_1e90 = auVar13._0_4_;
          fStack_1e8c = auVar13._4_4_;
          fStack_1e88 = auVar13._8_4_;
          fStack_1e84 = auVar13._12_4_;
          local_1f00 = auVar12._0_4_;
          fStack_1efc = auVar12._4_4_;
          fStack_1ef8 = auVar12._8_4_;
          fStack_1ef4 = auVar12._12_4_;
          fStack_1ef0 = auVar11._0_4_;
          fStack_1eec = auVar11._4_4_;
          fStack_1ee8 = auVar11._8_4_;
          fStack_1ee4 = auVar11._12_4_;
          local_1280 = (float)local_29c0[lVar50 * 0x20 + 0x1c];
          fStack_127c = (float)((ulong)local_29c0[lVar50 * 0x20 + 0x1c] >> 0x20);
          fStack_1278 = (float)local_29c0[lVar50 * 0x20 + 0x1d];
          fStack_1274 = (float)((ulong)local_29c0[lVar50 * 0x20 + 0x1d] >> 0x20);
          fStack_1270 = (float)local_29c0[lVar50 * 0x20 + 0x1e];
          fStack_126c = (float)((ulong)local_29c0[lVar50 * 0x20 + 0x1e] >> 0x20);
          fStack_1268 = (float)local_29c0[lVar50 * 0x20 + 0x1f];
          fStack_1264 = (float)((ulong)local_29c0[lVar50 * 0x20 + 0x1f] >> 0x20);
          auVar11 = vinsertps_avx(ZEXT416(0x42000000),ZEXT416(0x42000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x42000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x42000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x42000000),ZEXT416(0x42000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x42000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x42000000),0x30);
          local_1f60 = auVar12._0_4_;
          fStack_1f5c = auVar12._4_4_;
          fStack_1f58 = auVar12._8_4_;
          fStack_1f54 = auVar12._12_4_;
          fStack_1f50 = auVar11._0_4_;
          fStack_1f4c = auVar11._4_4_;
          fStack_1f48 = auVar11._8_4_;
          fStack_1f44 = auVar11._12_4_;
          fStack_1344 = auVar17._28_4_;
          *local_2a10 = CONCAT44(fStack_113c +
                                 fStack_10bc + fStack_ffc + fStack_1bfc * fStack_107c + fStack_103c,
                                 local_1140 +
                                 local_10c0 + local_1000 + local_1c00 * local_1080 + local_1040);
          local_2a10[1] =
               CONCAT44(fStack_1134 +
                        fStack_10b4 + fStack_ff4 + fStack_1bf4 * fStack_1074 + fStack_1034,
                        fStack_1138 +
                        fStack_10b8 + fStack_ff8 + fStack_1bf8 * fStack_1078 + fStack_1038);
          local_2a10[2] =
               CONCAT44(fStack_112c +
                        fStack_10ac + fStack_fec + fStack_1bec * fStack_106c + fStack_102c,
                        fStack_1130 +
                        fStack_10b0 + fStack_ff0 + fStack_1bf0 * fStack_1070 + fStack_1030);
          local_2a10[3] =
               CONCAT44(fStack_1124 +
                        fStack_10a4 + fStack_fe4 + fStack_1be4 + fStack_1024 + fStack_1044,
                        fStack_1128 +
                        fStack_10a8 + fStack_fe8 + fStack_1be8 * fStack_1068 + fStack_1028);
          local_2a10[4] =
               CONCAT44(fStack_113c +
                        fStack_1e3c * fStack_a1c + fStack_1ddc * fStack_a5c + fStack_145c,
                        local_1140 + local_1e40 * local_a20 + local_1de0 * local_a60 + local_1460);
          local_2a10[5] =
               CONCAT44(fStack_1134 +
                        fStack_1e34 * fStack_a14 + fStack_1dd4 * fStack_a54 + fStack_1454,
                        fStack_1138 +
                        fStack_1e38 * fStack_a18 + fStack_1dd8 * fStack_a58 + fStack_1458);
          local_2a10[6] =
               CONCAT44(fStack_112c +
                        fStack_1e2c * fStack_a0c + fStack_1dcc * fStack_a4c + fStack_144c,
                        fStack_1130 +
                        fStack_1e30 * fStack_a10 + fStack_1dd0 * fStack_a50 + fStack_1450);
          local_2a10[7] =
               CONCAT44(fStack_1124 + fStack_1e24 + fStack_1dc4 + fStack_1444,
                        fStack_1128 +
                        fStack_1e28 * fStack_a08 + fStack_1dc8 * fStack_a48 + fStack_1448);
          local_2a10[8] =
               CONCAT44(fStack_113c +
                        fStack_1cbc * fStack_107c + fStack_1c5c * fStack_103c + fStack_ffc,
                        local_1140 + local_1cc0 * local_1080 + local_1c60 * local_1040 + local_1000)
          ;
          local_2a10[9] =
               CONCAT44(fStack_1134 +
                        fStack_1cb4 * fStack_1074 + fStack_1c54 * fStack_1034 + fStack_ff4,
                        fStack_1138 +
                        fStack_1cb8 * fStack_1078 + fStack_1c58 * fStack_1038 + fStack_ff8);
          local_2a10[10] =
               CONCAT44(fStack_112c +
                        fStack_1cac * fStack_106c + fStack_1c4c * fStack_102c + fStack_fec,
                        fStack_1130 +
                        fStack_1cb0 * fStack_1070 + fStack_1c50 * fStack_1030 + fStack_ff0);
          local_2a10[0xb] =
               CONCAT44(fStack_1124 + fStack_1ca4 + fStack_1c44 + fStack_fe4,
                        fStack_1128 +
                        fStack_1ca8 * fStack_1068 + fStack_1c48 * fStack_1028 + fStack_fe8);
          local_2a10[0xc] =
               CONCAT44(fStack_113c +
                        fStack_1efc * fStack_a1c + fStack_1e9c * fStack_a5c + fStack_145c,
                        local_1140 + local_1f00 * local_a20 + local_1ea0 * local_a60 + local_1460);
          local_2a10[0xd] =
               CONCAT44(fStack_1134 +
                        fStack_1ef4 * fStack_a14 + fStack_1e94 * fStack_a54 + fStack_1454,
                        fStack_1138 +
                        fStack_1ef8 * fStack_a18 + fStack_1e98 * fStack_a58 + fStack_1458);
          local_2a10[0xe] =
               CONCAT44(fStack_112c +
                        fStack_1eec * fStack_a0c + fStack_1e8c * fStack_a4c + fStack_144c,
                        fStack_1130 +
                        fStack_1ef0 * fStack_a10 + fStack_1e90 * fStack_a50 + fStack_1450);
          local_2a10[0xf] =
               CONCAT44(fStack_1124 + fStack_1ee4 + fStack_1e84 + fStack_1444,
                        fStack_1128 +
                        fStack_1ee8 * fStack_a08 + fStack_1e88 * fStack_a48 + fStack_1448);
          local_2a10[0x10] =
               CONCAT44(fStack_113c +
                        fStack_1d7c * fStack_107c + fStack_1d1c * fStack_103c + fStack_ffc,
                        local_1140 + local_1d80 * local_1080 + local_1d20 * local_1040 + local_1000)
          ;
          local_2a10[0x11] =
               CONCAT44(fStack_1134 +
                        fStack_1d74 * fStack_1074 + fStack_1d14 * fStack_1034 + fStack_ff4,
                        fStack_1138 +
                        fStack_1d78 * fStack_1078 + fStack_1d18 * fStack_1038 + fStack_ff8);
          local_2a10[0x12] =
               CONCAT44(fStack_112c +
                        fStack_1d6c * fStack_106c + fStack_1d0c * fStack_102c + fStack_fec,
                        fStack_1130 +
                        fStack_1d70 * fStack_1070 + fStack_1d10 * fStack_1030 + fStack_ff0);
          local_2a10[0x13] =
               CONCAT44(fStack_1124 + fStack_1d64 + fStack_1d04 + fStack_fe4,
                        fStack_1128 +
                        fStack_1d68 * fStack_1068 + fStack_1d08 * fStack_1028 + fStack_fe8);
          local_2a10[0x14] =
               CONCAT44(fStack_113c +
                        fStack_127c + fStack_145c + fStack_1f5c * fStack_a5c + fStack_a1c,
                        local_1140 + local_1280 + local_1460 + local_1f60 * local_a60 + local_a20);
          local_2a10[0x15] =
               CONCAT44(fStack_1134 +
                        fStack_1274 + fStack_1454 + fStack_1f54 * fStack_a54 + fStack_a14,
                        fStack_1138 +
                        fStack_1278 + fStack_1458 + fStack_1f58 * fStack_a58 + fStack_a18);
          local_2a10[0x16] =
               CONCAT44(fStack_112c +
                        fStack_126c + fStack_144c + fStack_1f4c * fStack_a4c + fStack_a0c,
                        fStack_1130 +
                        fStack_1270 + fStack_1450 + fStack_1f50 * fStack_a50 + fStack_a10);
          local_2a10[0x17] =
               CONCAT44(fStack_1124 + fStack_1264 + fStack_1444 + fStack_1f44 + fStack_1344,
                        fStack_1128 +
                        fStack_1268 + fStack_1448 + fStack_1f48 * fStack_a48 + fStack_a08);
          local_2a10 = (undefined8 *)((long)local_2a10 + (long)(iVar1 << 3) * 4);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_output_pack8_avx(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 6;
    const int h_tiles = outh / 6;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[6][8] = {
    //     {1.0f,  1.0f,   1.0f,   1.0f,   1.0f,  32.0f, 32.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   2.0f,  -2.0f,  16.0f,-16.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,   4.0f,   4.0f,   8.0f,  8.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   8.0f,  -8.0f,   4.0f, -4.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,  16.0f,  16.0f,   2.0f,  2.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,  32.0f, -32.0f,   1.0f, -1.0f, 1.0f}
    // };

    // 0 = r0 + (r1 + r2) + (r3 + r4)     + (r5 + r6) * 32
    // 1 =      (r1 - r2) + (r3 - r4) * 2 + (r5 - r6) * 16
    // 2 =      (r1 + r2) + (r3 + r4) * 4 + (r5 + r6) * 8
    // 3 =      (r1 - r2) + (r3 - r4) * 8 + (r5 - r6) * 4
    // 4 =      (r1 + r2) + (r3 + r4) * 16+ (r5 + r6) * 2
    // 5 = r7 + (r1 - r2) + (r3 - r4) * 32+ (r5 - r6)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = biasptr ? _mm256_loadu_ps(biasptr + p * 8) : _mm256_setzero_ps();

#ifdef _MSC_VER
        __declspec(align(32))
#else
        __attribute__((aligned(32)))
#endif
        float tmp[6][8][8];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j) * 8;
                const float* output0_tm_1 = output0_tm_0 + tiles * 8;
                const float* output0_tm_2 = output0_tm_0 + tiles * 16;
                const float* output0_tm_3 = output0_tm_0 + tiles * 24;
                const float* output0_tm_4 = output0_tm_0 + tiles * 32;
                const float* output0_tm_5 = output0_tm_0 + tiles * 40;
                const float* output0_tm_6 = output0_tm_0 + tiles * 48;
                const float* output0_tm_7 = output0_tm_0 + tiles * 56;

                float* output0 = out0.row(i * 6) + (j * 6) * 8;

                for (int m = 0; m < 8; m++)
                {
                    __m256 _out0tm0 = _mm256_load_ps(output0_tm_0);
                    __m256 _out0tm1 = _mm256_load_ps(output0_tm_1);
                    __m256 _out0tm2 = _mm256_load_ps(output0_tm_2);
                    __m256 _out0tm3 = _mm256_load_ps(output0_tm_3);
                    __m256 _out0tm4 = _mm256_load_ps(output0_tm_4);
                    __m256 _out0tm5 = _mm256_load_ps(output0_tm_5);
                    __m256 _out0tm6 = _mm256_load_ps(output0_tm_6);
                    __m256 _out0tm7 = _mm256_load_ps(output0_tm_7);

                    __m256 _tmp024a = _mm256_add_ps(_out0tm1, _out0tm2);
                    __m256 _tmp135a = _mm256_sub_ps(_out0tm1, _out0tm2);

                    __m256 _tmp024b = _mm256_add_ps(_out0tm3, _out0tm4);
                    __m256 _tmp135b = _mm256_sub_ps(_out0tm3, _out0tm4);

                    __m256 _tmp024c = _mm256_add_ps(_out0tm5, _out0tm6);
                    __m256 _tmp135c = _mm256_sub_ps(_out0tm5, _out0tm6);

                    __m256 _tmp0m = _mm256_add_ps(_mm256_add_ps(_out0tm0, _tmp024a), _mm256_comp_fmadd_ps(_mm256_set1_ps(32.f), _tmp024c, _tmp024b));
                    __m256 _tmp2m = _mm256_comp_fmadd_ps(_mm256_set1_ps(8.f), _tmp024c, _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _tmp024b, _tmp024a));
                    __m256 _tmp4m = _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _tmp024c, _mm256_comp_fmadd_ps(_mm256_set1_ps(16.f), _tmp024b, _tmp024a));

                    __m256 _tmp1m = _mm256_comp_fmadd_ps(_mm256_set1_ps(16.f), _tmp135c, _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _tmp135b, _tmp135a));
                    __m256 _tmp3m = _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _tmp135c, _mm256_comp_fmadd_ps(_mm256_set1_ps(8.f), _tmp135b, _tmp135a));
                    __m256 _tmp5m = _mm256_add_ps(_mm256_add_ps(_out0tm7, _tmp135a), _mm256_comp_fmadd_ps(_mm256_set1_ps(32.f), _tmp135b, _tmp135c));

#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    _mm256_storeu_ps(tmp[0][m], _tmp0m);
                    _mm256_storeu_ps(tmp[1][m], _tmp1m);
                    _mm256_storeu_ps(tmp[2][m], _tmp2m);
                    _mm256_storeu_ps(tmp[3][m], _tmp3m);
                    _mm256_storeu_ps(tmp[4][m], _tmp4m);
                    _mm256_storeu_ps(tmp[5][m], _tmp5m);
#else
                    _mm256_store_ps(tmp[0][m], _tmp0m);
                    _mm256_store_ps(tmp[1][m], _tmp1m);
                    _mm256_store_ps(tmp[2][m], _tmp2m);
                    _mm256_store_ps(tmp[3][m], _tmp3m);
                    _mm256_store_ps(tmp[4][m], _tmp4m);
                    _mm256_store_ps(tmp[5][m], _tmp5m);
#endif

                    output0_tm_0 += tiles * 64;
                    output0_tm_1 += tiles * 64;
                    output0_tm_2 += tiles * 64;
                    output0_tm_3 += tiles * 64;
                    output0_tm_4 += tiles * 64;
                    output0_tm_5 += tiles * 64;
                    output0_tm_6 += tiles * 64;
                    output0_tm_7 += tiles * 64;
                }

                for (int m = 0; m < 6; m++)
                {
#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    __m256 _tmp00 = _mm256_loadu_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_loadu_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_loadu_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_loadu_ps(tmp[m][3]);
                    __m256 _tmp04 = _mm256_loadu_ps(tmp[m][4]);
                    __m256 _tmp05 = _mm256_loadu_ps(tmp[m][5]);
                    __m256 _tmp06 = _mm256_loadu_ps(tmp[m][6]);
                    __m256 _tmp07 = _mm256_loadu_ps(tmp[m][7]);
#else
                    __m256 _tmp00 = _mm256_load_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_load_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_load_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_load_ps(tmp[m][3]);
                    __m256 _tmp04 = _mm256_load_ps(tmp[m][4]);
                    __m256 _tmp05 = _mm256_load_ps(tmp[m][5]);
                    __m256 _tmp06 = _mm256_load_ps(tmp[m][6]);
                    __m256 _tmp07 = _mm256_load_ps(tmp[m][7]);
#endif

                    __m256 _tmp024a = _mm256_add_ps(_tmp01, _tmp02);
                    __m256 _tmp135a = _mm256_sub_ps(_tmp01, _tmp02);

                    __m256 _tmp024b = _mm256_add_ps(_tmp03, _tmp04);
                    __m256 _tmp135b = _mm256_sub_ps(_tmp03, _tmp04);

                    __m256 _tmp024c = _mm256_add_ps(_tmp05, _tmp06);
                    __m256 _tmp135c = _mm256_sub_ps(_tmp05, _tmp06);

                    __m256 _out00 = _mm256_add_ps(_bias0, _mm256_add_ps(_mm256_add_ps(_tmp00, _tmp024a), _mm256_comp_fmadd_ps(_mm256_set1_ps(32.f), _tmp024c, _tmp024b)));
                    __m256 _out02 = _mm256_add_ps(_bias0, _mm256_comp_fmadd_ps(_mm256_set1_ps(8.f), _tmp024c, _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _tmp024b, _tmp024a)));
                    __m256 _out04 = _mm256_add_ps(_bias0, _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _tmp024c, _mm256_comp_fmadd_ps(_mm256_set1_ps(16.f), _tmp024b, _tmp024a)));

                    __m256 _out01 = _mm256_add_ps(_bias0, _mm256_comp_fmadd_ps(_mm256_set1_ps(16.f), _tmp135c, _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _tmp135b, _tmp135a)));
                    __m256 _out03 = _mm256_add_ps(_bias0, _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _tmp135c, _mm256_comp_fmadd_ps(_mm256_set1_ps(8.f), _tmp135b, _tmp135a)));
                    __m256 _out05 = _mm256_add_ps(_bias0, _mm256_add_ps(_mm256_add_ps(_tmp07, _tmp135a), _mm256_comp_fmadd_ps(_mm256_set1_ps(32.f), _tmp135b, _tmp135c)));

                    _mm256_store_ps(output0, _out00);
                    _mm256_store_ps(output0 + 8, _out01);
                    _mm256_store_ps(output0 + 16, _out02);
                    _mm256_store_ps(output0 + 24, _out03);
                    _mm256_store_ps(output0 + 32, _out04);
                    _mm256_store_ps(output0 + 40, _out05);

                    output0 += outw * 8;
                }
            }
        }
    }
}